

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass_p.h
# Opt level: O2

Error __thiscall
asmjit::v1_14::RAInstBuilder::addCallRet(RAInstBuilder *this,RAWorkReg *workReg,uint32_t outId)

{
  long lVar1;
  undefined4 *puVar2;
  uint *puVar3;
  byte bVar4;
  uint uVar5;
  RegGroup group;
  
  if (outId == 0xff) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/arm/../arm/../core/../core/rapass_p.h"
               ,0x256,"outId != BaseReg::kIdBad");
  }
  group = (byte)workReg[0x21] & kMaxValue;
  bVar4 = (byte)outId;
  uVar5 = 1 << (bVar4 & 0x1f);
  this[8] = (RAInstBuilder)((byte)this[8] | 0x8a);
  puVar3 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     ((Array<unsigned_int,_4UL> *)(this + 0x18),&group);
  *puVar3 = *puVar3 | uVar5;
  *(uint *)(this + 0x14) = *(uint *)(this + 0x14) | 0x101 << (group & 0x1f);
  lVar1 = *(long *)(workReg + 0x10);
  if (lVar1 == 0) {
    puVar2 = *(undefined4 **)(this + 0x38);
    if (((long)puVar2 + (-0x40 - (long)this) & 0x1ffffff000U) != 0) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/arm/../arm/../core/../core/rapass_p.h"
                 ,0x264,"tiedRegCount() < ASMJIT_ARRAY_SIZE(_tiedRegs)");
    }
    *(undefined4 **)(this + 0x38) = puVar2 + 8;
    *puVar2 = *(undefined4 *)workReg;
    *(undefined8 *)(puVar2 + 1) = 0x8affffffff;
    *(undefined2 *)(puVar2 + 3) = 1;
    *(undefined1 *)((long)puVar2 + 0xe) = 0xff;
    *(byte *)((long)puVar2 + 0xf) = bVar4;
    puVar2[4] = 0xffffffff;
    puVar2[5] = uVar5;
    *(undefined8 *)(puVar2 + 6) = 0;
    *(undefined4 **)(workReg + 0x10) = puVar2;
    *(undefined4 *)(workReg + 0x28) = *(undefined4 *)this;
    RARegCount::add((RARegCount *)(this + 0x10),group,1);
  }
  else {
    if (*(char *)(lVar1 + 0xf) != -1) {
      return 0x41;
    }
    *(char *)(lVar1 + 0xc) = *(char *)(lVar1 + 0xc) + '\x01';
    *(byte *)(lVar1 + 8) = *(byte *)(lVar1 + 8) | 0x8a;
    *(byte *)(lVar1 + 0xf) = bVar4;
  }
  return 0;
}

Assistant:

Error addCallRet(RAWorkReg* workReg, uint32_t outId) noexcept {
    ASMJIT_ASSERT(outId != BaseReg::kIdBad);

    RATiedFlags flags = RATiedFlags::kOut | RATiedFlags::kWrite | RATiedFlags::kOutFixed;
    RegGroup group = workReg->group();
    RegMask outRegs = Support::bitMask(outId);

    _aggregatedFlags |= flags;
    _used[group] |= outRegs;
    _stats.makeFixed(group);
    _stats.makeUsed(group);

    RATiedReg* tiedReg = workReg->tiedReg();
    if (!tiedReg) {
      // Could happen when the builder is not reset properly after each instruction.
      ASMJIT_ASSERT(tiedRegCount() < ASMJIT_ARRAY_SIZE(_tiedRegs));

      tiedReg = _cur++;
      tiedReg->init(workReg->workId(), flags, Support::allOnes<RegMask>(), BaseReg::kIdBad, 0, outRegs, outId, 0);

      workReg->setTiedReg(tiedReg);
      workReg->assignBasicBlock(_basicBlockId);

      _count.add(group);
      return kErrorOk;
    }
    else {
      if (tiedReg->hasOutId())
        return DebugUtils::errored(kErrorOverlappedRegs);

      tiedReg->addRefCount();
      tiedReg->addFlags(flags);
      tiedReg->setOutId(outId);
      return kErrorOk;
    }
  }